

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::MacroExtractor::GetMacroDefinition
                  (Value *__return_storage_ptr__,ScalarMacroCatalogEntry *entry,idx_t offset)

{
  reference this;
  type this_00;
  ScalarMacroFunction *pSVar1;
  pointer pPVar2;
  string local_30;
  
  this = vector<duckdb::unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>,_true>
         ::get<true>(&(entry->super_MacroCatalogEntry).macros,offset);
  this_00 = unique_ptr<duckdb::MacroFunction,_std::default_delete<duckdb::MacroFunction>,_true>::
            operator*(this);
  pSVar1 = MacroFunction::Cast<duckdb::ScalarMacroFunction>(this_00);
  pPVar2 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->(&pSVar1->expression);
  (*(pPVar2->super_BaseExpression)._vptr_BaseExpression[8])(&local_30,pPVar2);
  Value::Value(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

static Value GetMacroDefinition(ScalarMacroCatalogEntry &entry, idx_t offset) {
		auto &macro_entry = *entry.macros[offset];
		D_ASSERT(macro_entry.type == MacroType::SCALAR_MACRO);
		auto &func = macro_entry.Cast<ScalarMacroFunction>();
		return func.expression->ToString();
	}